

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_protozero::const_varint_iterator<long>_&,_const_protozero::const_varint_iterator<long>_&>
* __thiscall
Catch::ExprLhs<protozero::const_varint_iterator<long>const&>::operator!=
          (BinaryExpr<const_protozero::const_varint_iterator<long>_&,_const_protozero::const_varint_iterator<long>_&>
           *__return_storage_ptr__,ExprLhs<protozero::const_varint_iterator<long>const&> *this,
          const_varint_iterator<long> *rhs)

{
  const_varint_iterator<long> *lhs;
  bool comparisonResult;
  StringRef local_30;
  const_varint_iterator<long> *local_20;
  const_varint_iterator<long> *rhs_local;
  ExprLhs<const_protozero::const_varint_iterator<long>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (const_varint_iterator<long> *)this;
  this_local = (ExprLhs<const_protozero::const_varint_iterator<long>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareNotEqual<protozero::const_varint_iterator<long>,protozero::const_varint_iterator<long>const&>
                 (*(const_varint_iterator<long> **)this,rhs);
  lhs = *(const_varint_iterator<long> **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_protozero::const_varint_iterator<long>_&,_const_protozero::const_varint_iterator<long>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }